

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__light_linear_attenuation
          (ColladaParserAutoGen14Private *this)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__light_linear_attenuation()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__light_linear_attenuation();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}